

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> * __thiscall
embree::XMLLoader::loadVec3fArray
          (vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
           *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  int iVar2;
  runtime_error *this_01;
  long *plVar3;
  long lVar4;
  size_type *psVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ofs","");
    XML::parm(&local_50,this_00,&local_70);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (iVar2 == 0) {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar4 = (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      if (0x5555555555555555 < (ulong)(lVar4 * -0x7b425ed097b425ed)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&xml->ptr->loc);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50._M_dataplus._M_p = (pointer)*plVar3;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_50._M_dataplus._M_p == psVar5) {
          local_50.field_2._M_allocated_capacity = *psVar5;
          local_50.field_2._8_8_ = plVar3[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar5;
        }
        local_50._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::resize
                (__return_storage_ptr__,(ulong)(lVar4 * -0x71c71c71c71c71c7) / 3);
      if ((__return_storage_ptr__->
          super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (__return_storage_ptr__->
          super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        lVar4 = 0x90;
        lVar7 = 8;
        uVar6 = 0;
        do {
          fVar8 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-2].ty +
                                        lVar4),true);
          fVar9 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].ty +
                                        lVar4),true);
          fVar10 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ty +
                                         lVar4),true);
          pVVar1 = (__return_storage_ptr__->
                   super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *(float *)((long)pVVar1 + lVar7 + -8) = fVar8;
          *(float *)((long)pVVar1 + lVar7 + -4) = fVar9;
          *(float *)((long)&pVVar1->field_0 + lVar7) = fVar10;
          uVar6 = uVar6 + 1;
          lVar4 = lVar4 + 0xd8;
          lVar7 = lVar7 + 0xc;
        } while (uVar6 < (ulong)(((long)(__return_storage_ptr__->
                                        super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(__return_storage_ptr__->
                                        super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 2) *
                                -0x5555555555555555));
      }
    }
    else {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                (__return_storage_ptr__,this,xml);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec3f> XMLLoader::loadVec3fArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec3f>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec3f>>(xml);
    } 
    else 
    {
      std::vector<Vec3f> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3f(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }